

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode
          (xmlNodePtr cur,xmlCatalogEntryType type,xmlChar *name,xmlChar *attrName,
          xmlChar *uriAttrName,xmlCatalogPrefer prefer,xmlCatalogEntryPtr cgroup)

{
  bool bVar1;
  xmlChar *URI;
  xmlChar *base_00;
  xmlChar *URL_00;
  xmlNodePtr local_68;
  xmlCatalogEntryPtr ret;
  xmlChar *URL;
  xmlChar *base;
  xmlChar *nameValue;
  xmlChar *uriValue;
  int ok;
  xmlCatalogPrefer prefer_local;
  xmlChar *uriAttrName_local;
  xmlChar *attrName_local;
  xmlChar *name_local;
  xmlCatalogEntryType type_local;
  xmlNodePtr cur_local;
  
  bVar1 = true;
  base = (xmlChar *)0x0;
  local_68 = (xmlNodePtr)0x0;
  if (attrName != (xmlChar *)0x0) {
    base = xmlGetProp(cur,attrName);
    if (base == (xmlChar *)0x0) {
      xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x672,"%s entry lacks \'%s\'\n",name,attrName,
                    (xmlChar *)0x0);
    }
    bVar1 = base != (xmlChar *)0x0;
  }
  URI = xmlGetProp(cur,uriAttrName);
  if (URI == (xmlChar *)0x0) {
    xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x672,"%s entry lacks \'%s\'\n",name,uriAttrName,
                  (xmlChar *)0x0);
    bVar1 = false;
  }
  if (bVar1) {
    base_00 = xmlNodeGetBase(cur->doc,cur);
    URL_00 = xmlBuildURI(URI,base_00);
    if (URL_00 == (xmlChar *)0x0) {
      xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x673,"%s entry \'%s\' broken ?: %s\n",name,
                    uriAttrName,URI);
    }
    else {
      if (1 < xmlDebugCatalogs) {
        if (base == (xmlChar *)0x0) {
          xmlCatalogPrintDebug("Found %s: \'%s\'\n",name,URL_00);
        }
        else {
          xmlCatalogPrintDebug("Found %s: \'%s\' \'%s\'\n",name,base,URL_00);
        }
      }
      local_68 = (xmlNodePtr)xmlNewCatalogEntry(type,base,URI,URL_00,prefer,cgroup);
    }
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
    if (URI != (xmlChar *)0x0) {
      (*xmlFree)(URI);
    }
    if (base_00 != (xmlChar *)0x0) {
      (*xmlFree)(base_00);
    }
    if (URL_00 != (xmlChar *)0x0) {
      (*xmlFree)(URL_00);
    }
    cur_local = local_68;
  }
  else {
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
    if (URI != (xmlChar *)0x0) {
      (*xmlFree)(URI);
    }
    cur_local = (xmlNodePtr)0x0;
  }
  return (xmlCatalogEntryPtr)cur_local;
}

Assistant:

static xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode(xmlNodePtr cur, xmlCatalogEntryType type,
			  const xmlChar *name, const xmlChar *attrName,
			  const xmlChar *uriAttrName, xmlCatalogPrefer prefer,
			  xmlCatalogEntryPtr cgroup) {
    int ok = 1;
    xmlChar *uriValue;
    xmlChar *nameValue = NULL;
    xmlChar *base = NULL;
    xmlChar *URL = NULL;
    xmlCatalogEntryPtr ret = NULL;

    if (attrName != NULL) {
	nameValue = xmlGetProp(cur, attrName);
	if (nameValue == NULL) {
	    xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
			  "%s entry lacks '%s'\n", name, attrName, NULL);
	    ok = 0;
	}
    }
    uriValue = xmlGetProp(cur, uriAttrName);
    if (uriValue == NULL) {
	xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
		"%s entry lacks '%s'\n", name, uriAttrName, NULL);
	ok = 0;
    }
    if (!ok) {
	if (nameValue != NULL)
	    xmlFree(nameValue);
	if (uriValue != NULL)
	    xmlFree(uriValue);
	return(NULL);
    }

    base = xmlNodeGetBase(cur->doc, cur);
    URL = xmlBuildURI(uriValue, base);
    if (URL != NULL) {
	if (xmlDebugCatalogs > 1) {
	    if (nameValue != NULL)
		xmlCatalogPrintDebug(
			"Found %s: '%s' '%s'\n", name, nameValue, URL);
	    else
		xmlCatalogPrintDebug(
			"Found %s: '%s'\n", name, URL);
	}
	ret = xmlNewCatalogEntry(type, nameValue, uriValue, URL, prefer, cgroup);
    } else {
	xmlCatalogErr(ret, cur, XML_CATALOG_ENTRY_BROKEN,
		"%s entry '%s' broken ?: %s\n", name, uriAttrName, uriValue);
    }
    if (nameValue != NULL)
	xmlFree(nameValue);
    if (uriValue != NULL)
	xmlFree(uriValue);
    if (base != NULL)
	xmlFree(base);
    if (URL != NULL)
	xmlFree(URL);
    return(ret);
}